

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

void tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info)

{
  pointer p_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  EXRChannelInfo *pEVar5;
  size_t __size;
  int *piVar6;
  EXRAttribute *pEVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  pointer paVar13;
  pointer p_Var14;
  
  exr_header->pixel_aspect_ratio = info->pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info->screen_window_center[0];
  exr_header->screen_window_center[1] = info->screen_window_center[1];
  exr_header->screen_window_width = info->screen_window_width;
  exr_header->chunk_count = info->chunk_count;
  iVar8 = (info->display_window).min_y;
  iVar2 = (info->display_window).max_x;
  iVar3 = (info->display_window).max_y;
  (exr_header->display_window).min_x = (info->display_window).min_x;
  (exr_header->display_window).min_y = iVar8;
  (exr_header->display_window).max_x = iVar2;
  (exr_header->display_window).max_y = iVar3;
  iVar8 = (info->data_window).min_y;
  iVar2 = (info->data_window).max_x;
  iVar3 = (info->data_window).max_y;
  (exr_header->data_window).min_x = (info->data_window).min_x;
  (exr_header->data_window).min_y = iVar8;
  (exr_header->data_window).max_x = iVar2;
  (exr_header->data_window).max_y = iVar3;
  exr_header->line_order = info->line_order;
  exr_header->compression_type = info->compression_type;
  iVar8 = info->tile_size_y;
  iVar2 = info->tile_level_mode;
  iVar3 = info->tile_rounding_mode;
  exr_header->tile_size_x = info->tile_size_x;
  exr_header->tile_size_y = iVar8;
  exr_header->tile_level_mode = iVar2;
  exr_header->tile_rounding_mode = iVar3;
  paVar13 = (info->channels).
            super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar8 = (int)((long)(info->channels).
                      super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13 >> 4) * -0x55555555
  ;
  exr_header->num_channels = iVar8;
  pEVar5 = (EXRChannelInfo *)malloc((long)iVar8 * 0x110);
  exr_header->channels = pEVar5;
  if (iVar8 == 0) {
    iVar8 = 0;
    __size = 0;
  }
  else {
    lVar11 = 0;
    lVar10 = 0;
    uVar12 = 0;
    do {
      strncpy(pEVar5->name + lVar10,*(char **)(paVar13->pad + lVar11 + -0x2d),0xff);
      exr_header->channels->pad[lVar10 + -0xe] = '\0';
      paVar13 = (info->channels).
                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pEVar5 = exr_header->channels;
      *(undefined4 *)(pEVar5->pad + lVar10 + -0xd) =
           *(undefined4 *)(paVar13->pad + lVar11 + 0xfffffffffffffff3);
      pEVar5->pad[lVar10 + -1] = paVar13->pad[lVar11 + 0xffffffffffffffff];
      *(undefined8 *)(pEVar5->pad + lVar10 + -9) =
           *(undefined8 *)(paVar13->pad + lVar11 + 0xfffffffffffffff7);
      uVar12 = uVar12 + 1;
      iVar8 = exr_header->num_channels;
      lVar10 = lVar10 + 0x110;
      lVar11 = lVar11 + 0x30;
    } while (uVar12 < (ulong)(long)iVar8);
    __size = (long)iVar8 << 2;
  }
  piVar6 = (int *)malloc(__size);
  exr_header->pixel_types = piVar6;
  if (iVar8 == 0) {
    piVar6 = (int *)malloc(0);
    exr_header->requested_pixel_types = piVar6;
  }
  else {
    lVar11 = (long)iVar8;
    piVar9 = &paVar13->pixel_type;
    lVar10 = 0;
    do {
      piVar6[lVar10] = *piVar9;
      lVar10 = lVar10 + 1;
      piVar9 = piVar9 + 0xc;
    } while (lVar11 != lVar10);
    piVar6 = (int *)malloc(lVar11 * 4);
    exr_header->requested_pixel_types = piVar6;
    if (iVar8 != 0) {
      piVar9 = &paVar13->pixel_type;
      lVar10 = 0;
      do {
        piVar6[lVar10] = *piVar9;
        lVar10 = lVar10 + 1;
        piVar9 = piVar9 + 0xc;
      } while (lVar11 != lVar10);
    }
  }
  p_Var14 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
            _M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (int)((long)p_Var1 - (long)p_Var14 >> 4) * 0x3e0f83e1;
  exr_header->num_custom_attributes = uVar4;
  if ((int)uVar4 < 1) {
    exr_header->custom_attributes = (EXRAttribute *)0x0;
  }
  else {
    if (0x80 < uVar4) {
      exr_header->num_custom_attributes = 0x80;
      uVar4 = 0x80;
    }
    pEVar7 = (EXRAttribute *)malloc((ulong)(uVar4 & 0x7fffffff) * 0x210);
    exr_header->custom_attributes = pEVar7;
    if (p_Var1 != p_Var14) {
      lVar10 = 0;
      uVar12 = 0;
      do {
        memcpy(pEVar7->name + lVar10,p_Var14->name + lVar10,0x100);
        memcpy(exr_header->custom_attributes->type + lVar10,
               ((info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start)->type + lVar10,0x100);
        p_Var14 = (info->attributes).
                  super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pEVar7 = exr_header->custom_attributes;
        *(undefined4 *)((long)&pEVar7->size + lVar10) =
             *(undefined4 *)((long)&p_Var14->size + lVar10);
        *(undefined8 *)((long)&pEVar7->value + lVar10) =
             *(undefined8 *)((long)&p_Var14->value + lVar10);
        uVar12 = uVar12 + 1;
        lVar10 = lVar10 + 0x210;
      } while (uVar12 < (ulong)(((long)(info->attributes).
                                       super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var14 >>
                                4) * 0xf83e0f83e0f83e1));
    }
  }
  exr_header->header_len = info->header_len;
  return;
}

Assistant:

static void ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window.min_x = info.display_window.min_x;
  exr_header->display_window.min_y = info.display_window.min_y;
  exr_header->display_window.max_x = info.display_window.max_x;
  exr_header->display_window.max_y = info.display_window.max_y;
  exr_header->data_window.min_x = info.data_window.min_x;
  exr_header->data_window.min_y = info.data_window.min_y;
  exr_header->data_window.max_x = info.data_window.max_x;
  exr_header->data_window.max_y = info.data_window.max_y;
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;

  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
#ifdef _MSC_VER
    strncpy_s(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#else
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#endif
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  if (exr_header->num_custom_attributes > 0) {
    // TODO(syoyo): Report warning when # of attributes exceeds
    // `TINYEXR_MAX_CUSTOM_ATTRIBUTES`
    if (exr_header->num_custom_attributes > TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
      exr_header->num_custom_attributes = TINYEXR_MAX_CUSTOM_ATTRIBUTES;
    }

    exr_header->custom_attributes = static_cast<EXRAttribute *>(malloc(
        sizeof(EXRAttribute) * size_t(exr_header->num_custom_attributes)));

    for (size_t i = 0; i < info.attributes.size(); i++) {
      memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name,
             256);
      memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type,
             256);
      exr_header->custom_attributes[i].size = info.attributes[i].size;
      // Just copy pointer
      exr_header->custom_attributes[i].value = info.attributes[i].value;
    }

  } else {
    exr_header->custom_attributes = NULL;
  }

  exr_header->header_len = info.header_len;
}